

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getchaintxstats(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffef78;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffef88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefb0;
  allocator<char> *in_stack_ffffffffffffefb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc0;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  string *in_stack_ffffffffffffefd0;
  undefined7 in_stack_ffffffffffffefd8;
  undefined1 in_stack_ffffffffffffefdf;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffefe0;
  string *in_stack_ffffffffffffefe8;
  undefined1 *puVar3;
  RPCArg *in_stack_ffffffffffffeff0;
  RPCResult *in_stack_ffffffffffffeff8;
  RPCResult *this_01;
  undefined1 *local_ff8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  RPCMethodImpl *in_stack_fffffffffffff1e0;
  undefined1 local_e00 [36];
  allocator<char> local_ddc;
  allocator<char> local_ddb;
  allocator<char> local_dda [2];
  pointer local_dd8;
  pointer pRStack_dd0;
  pointer local_dc8;
  allocator<char> local_dba;
  allocator<char> local_db9 [31];
  allocator<char> local_d9a;
  allocator<char> local_d99 [31];
  allocator<char> local_d7a;
  allocator<char> local_d79 [17];
  undefined8 local_d68;
  allocator<char> local_d5a;
  allocator<char> local_d59;
  undefined1 local_d58 [16];
  undefined1 local_d48 [14];
  undefined1 local_d3a;
  undefined1 local_d39 [9];
  size_type sStack_d30;
  undefined1 local_d28 [14];
  undefined1 local_d1a [2];
  pointer local_d18;
  pointer pbStack_d10;
  undefined8 local_d08;
  allocator<char> local_cfa;
  allocator<char> local_cf9 [9];
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  allocator<char> local_cd1 [31];
  allocator<char> local_cb2;
  allocator<char> local_cb1 [27];
  allocator<char> local_c96;
  allocator<char> local_c95;
  allocator<char> local_c94;
  allocator<char> local_c93;
  allocator<char> local_c92;
  allocator<char> local_c91 [31];
  allocator<char> local_c72;
  allocator<char> local_c71 [769];
  undefined1 local_970 [408];
  vector<RPCArg,_std::allocator<RPCArg>_> local_7d8 [28];
  undefined1 local_530 [200];
  undefined1 local_468;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined1 local_427;
  undefined1 local_360;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined1 local_320;
  undefined1 local_31f;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  this_01 = (RPCResult *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_360 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef90);
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef78);
  local_320 = 0;
  local_31f = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                 (Type)((ulong)in_stack_ffffffffffffefe0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
                 in_stack_ffffffffffffefd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_468 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef90);
  local_440 = 0;
  uStack_438 = 0;
  local_430 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef78);
  local_428 = 0;
  local_427 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                 (Type)((ulong)in_stack_ffffffffffffefe0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
                 in_stack_ffffffffffffefd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffef78);
  __l._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffefb8,__l,
             (allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
                 in_stack_ffffffffffffefc0);
  local_cf9[1] = (allocator<char>)0x0;
  local_cf9[2] = (allocator<char>)0x0;
  local_cf9[3] = (allocator<char>)0x0;
  local_cf9[4] = (allocator<char>)0x0;
  local_cf9[5] = (allocator<char>)0x0;
  local_cf9[6] = (allocator<char>)0x0;
  local_cf9[7] = (allocator<char>)0x0;
  local_cf9[8] = (allocator<char>)0x0;
  uStack_cf0 = 0;
  local_ce8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef78);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
             &in_stack_ffffffffffffeff0->m_names,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0
             ,(bool)in_stack_ffffffffffffefdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_d18 = (pointer)0x0;
  pbStack_d10 = (pointer)0x0;
  local_d08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef78);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffef78 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeff8,(Type)((ulong)in_stack_ffffffffffffeff0 >> 0x20),
             in_stack_ffffffffffffefe8,SUB81((ulong)in_stack_ffffffffffffefe0 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefd0,
             (bool)in_stack_ffffffffffffefcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  this_02 = (RPCHelpMan *)local_d1a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_d39._1_8_ = (pointer)0x0;
  sStack_d30 = 0;
  local_d28._0_8_ = 0;
  name = (string *)(local_d39 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
             &in_stack_ffffffffffffeff0->m_names,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0
             ,(bool)in_stack_ffffffffffffefdf);
  args = local_7d8;
  description = (string *)local_d39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  results = (RPCResults *)&local_d3a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_d58._0_8_ = (pointer)0x0;
  local_d58._8_8_ = 0;
  local_d48._0_8_ = 0;
  examples = (RPCExamples *)local_d58;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
             &in_stack_ffffffffffffeff0->m_names,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0
             ,(bool)in_stack_ffffffffffffefdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_d79[1] = (allocator<char>)0x0;
  local_d79[2] = (allocator<char>)0x0;
  local_d79[3] = (allocator<char>)0x0;
  local_d79[4] = (allocator<char>)0x0;
  local_d79[5] = (allocator<char>)0x0;
  local_d79[6] = (allocator<char>)0x0;
  local_d79[7] = (allocator<char>)0x0;
  local_d79[8] = (allocator<char>)0x0;
  local_d79[9] = (allocator<char>)0x0;
  local_d79[10] = (allocator<char>)0x0;
  local_d79[0xb] = (allocator<char>)0x0;
  local_d79[0xc] = (allocator<char>)0x0;
  local_d79[0xd] = (allocator<char>)0x0;
  local_d79[0xe] = (allocator<char>)0x0;
  local_d79[0xf] = (allocator<char>)0x0;
  local_d79[0x10] = (allocator<char>)0x0;
  local_d68._0_1_ = '\0';
  local_d68._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
             &in_stack_ffffffffffffeff0->m_names,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0
             ,(bool)in_stack_ffffffffffffefdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_d99[1] = (allocator<char>)0x0;
  local_d99[2] = (allocator<char>)0x0;
  local_d99[3] = (allocator<char>)0x0;
  local_d99[4] = (allocator<char>)0x0;
  local_d99[5] = (allocator<char>)0x0;
  local_d99[6] = (allocator<char>)0x0;
  local_d99[7] = (allocator<char>)0x0;
  local_d99[8] = (allocator<char>)0x0;
  local_d99[9] = (allocator<char>)0x0;
  local_d99[10] = (allocator<char>)0x0;
  local_d99[0xb] = (allocator<char>)0x0;
  local_d99[0xc] = (allocator<char>)0x0;
  local_d99[0xd] = (allocator<char>)0x0;
  local_d99[0xe] = (allocator<char>)0x0;
  local_d99[0xf] = (allocator<char>)0x0;
  local_d99[0x10] = (allocator<char>)0x0;
  local_d99[0x11] = (allocator<char>)0x0;
  local_d99[0x12] = (allocator<char>)0x0;
  local_d99[0x13] = (allocator<char>)0x0;
  local_d99[0x14] = (allocator<char>)0x0;
  local_d99[0x15] = (allocator<char>)0x0;
  local_d99[0x16] = (allocator<char>)0x0;
  local_d99[0x17] = (allocator<char>)0x0;
  local_d99[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeff8,(Type)((ulong)in_stack_ffffffffffffeff0 >> 0x20),
             in_stack_ffffffffffffefe8,SUB81((ulong)in_stack_ffffffffffffefe0 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefd0,
             (bool)in_stack_ffffffffffffefcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_db9[1] = (allocator<char>)0x0;
  local_db9[2] = (allocator<char>)0x0;
  local_db9[3] = (allocator<char>)0x0;
  local_db9[4] = (allocator<char>)0x0;
  local_db9[5] = (allocator<char>)0x0;
  local_db9[6] = (allocator<char>)0x0;
  local_db9[7] = (allocator<char>)0x0;
  local_db9[8] = (allocator<char>)0x0;
  local_db9[9] = (allocator<char>)0x0;
  local_db9[10] = (allocator<char>)0x0;
  local_db9[0xb] = (allocator<char>)0x0;
  local_db9[0xc] = (allocator<char>)0x0;
  local_db9[0xd] = (allocator<char>)0x0;
  local_db9[0xe] = (allocator<char>)0x0;
  local_db9[0xf] = (allocator<char>)0x0;
  local_db9[0x10] = (allocator<char>)0x0;
  local_db9[0x11] = (allocator<char>)0x0;
  local_db9[0x12] = (allocator<char>)0x0;
  local_db9[0x13] = (allocator<char>)0x0;
  local_db9[0x14] = (allocator<char>)0x0;
  local_db9[0x15] = (allocator<char>)0x0;
  local_db9[0x16] = (allocator<char>)0x0;
  local_db9[0x17] = (allocator<char>)0x0;
  local_db9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeff8,(Type)((ulong)in_stack_ffffffffffffeff0 >> 0x20),
             in_stack_ffffffffffffefe8,SUB81((ulong)in_stack_ffffffffffffefe0 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefd0,
             (bool)in_stack_ffffffffffffefcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_dd8 = (pointer)0x0;
  pRStack_dd0 = (pointer)0x0;
  local_dc8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  this = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffeff8,(Type)((ulong)in_stack_ffffffffffffeff0 >> 0x20),
             in_stack_ffffffffffffefe8,SUB81((ulong)in_stack_ffffffffffffefe0 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffefdf,in_stack_ffffffffffffefd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefd0,
             (bool)in_stack_ffffffffffffefcf);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffefc8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffefc0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffefcf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefb8,__l_00,
             (allocator_type *)in_stack_ffffffffffffefb0);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)in_stack_ffffffffffffeff8 >> 0x20),
             &in_stack_ffffffffffffeff0->m_names,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0
             ,(bool)in_stack_ffffffffffffefdf);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_ffffffffffffeff8,(RPCResult *)in_stack_ffffffffffffeff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  HelpExampleCli(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (char *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  HelpExampleRpc(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  std::operator+(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x5475a8);
  this_00 = (RPCArg *)local_e00;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getchaintxstats()::__0,void>
            (in_stack_ffffffffffffef88,(anon_class_1_0_00000001 *)in_stack_ffffffffffffef80);
  RPCHelpMan::RPCHelpMan(this_02,name,description,args,results,examples,in_stack_fffffffffffff1e0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_e00 + 0x23));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_ddc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_ddb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_dda);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar3 = local_970;
  local_ff8 = local_530;
  do {
    local_ff8 = local_ff8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_ff8 != puVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_dba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_db9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d9a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d7a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d5a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_d3a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_d39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_d1a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_d1a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_cfa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_cf9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef88);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_cd1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_cb2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_cb1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c96);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c95);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c94);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c93);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c92);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_c91);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c72);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_c71);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchaintxstats()
{
    return RPCHelpMan{"getchaintxstats",
                "\nCompute statistics about the total number and rate of transactions in the chain.\n",
                {
                    {"nblocks", RPCArg::Type::NUM, RPCArg::DefaultHint{"one month"}, "Size of the window in number of blocks"},
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::DefaultHint{"chain tip"}, "The hash of the block that ends the window."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM_TIME, "time", "The timestamp for the final block in the window, expressed in " + UNIX_EPOCH_TIME},
                        {RPCResult::Type::NUM, "txcount", /*optional=*/true,
                         "The total number of transactions in the chain up to that point, if known. "
                         "It may be unknown when using assumeutxo."},
                        {RPCResult::Type::STR_HEX, "window_final_block_hash", "The hash of the final block in the window"},
                        {RPCResult::Type::NUM, "window_final_block_height", "The height of the final block in the window."},
                        {RPCResult::Type::NUM, "window_block_count", "Size of the window in number of blocks"},
                        {RPCResult::Type::NUM, "window_interval", /*optional=*/true, "The elapsed time in the window in seconds. Only returned if \"window_block_count\" is > 0"},
                        {RPCResult::Type::NUM, "window_tx_count", /*optional=*/true,
                         "The number of transactions in the window. "
                         "Only returned if \"window_block_count\" is > 0 and if txcount exists for the start and end of the window."},
                        {RPCResult::Type::NUM, "txrate", /*optional=*/true,
                         "The average rate of transactions per second in the window. "
                         "Only returned if \"window_interval\" is > 0 and if window_tx_count exists."},
                    }},
                RPCExamples{
                    HelpExampleCli("getchaintxstats", "")
            + HelpExampleRpc("getchaintxstats", "2016")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    const CBlockIndex* pindex;
    int blockcount = 30 * 24 * 60 * 60 / chainman.GetParams().GetConsensus().nPowTargetSpacing; // By default: 1 month

    if (request.params[1].isNull()) {
        LOCK(cs_main);
        pindex = chainman.ActiveChain().Tip();
    } else {
        uint256 hash(ParseHashV(request.params[1], "blockhash"));
        LOCK(cs_main);
        pindex = chainman.m_blockman.LookupBlockIndex(hash);
        if (!pindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
        if (!chainman.ActiveChain().Contains(pindex)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Block is not in main chain");
        }
    }

    CHECK_NONFATAL(pindex != nullptr);

    if (request.params[0].isNull()) {
        blockcount = std::max(0, std::min(blockcount, pindex->nHeight - 1));
    } else {
        blockcount = request.params[0].getInt<int>();

        if (blockcount < 0 || (blockcount > 0 && blockcount >= pindex->nHeight)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid block count: should be between 0 and the block's height - 1");
        }
    }

    const CBlockIndex& past_block{*CHECK_NONFATAL(pindex->GetAncestor(pindex->nHeight - blockcount))};
    const int64_t nTimeDiff{pindex->GetMedianTimePast() - past_block.GetMedianTimePast()};

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("time", (int64_t)pindex->nTime);
    if (pindex->m_chain_tx_count) {
        ret.pushKV("txcount", pindex->m_chain_tx_count);
    }
    ret.pushKV("window_final_block_hash", pindex->GetBlockHash().GetHex());
    ret.pushKV("window_final_block_height", pindex->nHeight);
    ret.pushKV("window_block_count", blockcount);
    if (blockcount > 0) {
        ret.pushKV("window_interval", nTimeDiff);
        if (pindex->m_chain_tx_count != 0 && past_block.m_chain_tx_count != 0) {
            const auto window_tx_count = pindex->m_chain_tx_count - past_block.m_chain_tx_count;
            ret.pushKV("window_tx_count", window_tx_count);
            if (nTimeDiff > 0) {
                ret.pushKV("txrate", double(window_tx_count) / nTimeDiff);
            }
        }
    }

    return ret;
},
    };
}